

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall JSON::Parser::readStringToken(Token *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  string local_c8 [32];
  string local_a8 [39];
  byte local_81;
  string local_80 [7];
  bool isEscapeChar;
  string value;
  int local_5c;
  int code;
  int chunkStart;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  Parser *local_18;
  Parser *this_local;
  Token *token;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  Token::Token(__return_storage_ptr__,STRING,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  __return_storage_ptr__->start = this->pos;
  this->pos = this->pos + 1;
  std::__cxx11::string::string(local_80);
  local_81 = 0;
  while (bVar1 = isValidPos(this), bVar1) {
    if ((local_81 & 1) == 0) {
      local_5c = getCodeAt(this,this->pos);
      if (local_5c == 0x22) break;
      if (local_5c == 0x5c) {
        local_81 = 1;
        std::__cxx11::string::substr((ulong)local_a8,(ulong)&this->input);
        std::__cxx11::string::operator+=(local_80,local_a8);
        std::__cxx11::string::~string(local_a8);
        this->pos = this->pos + 1;
      }
      else {
        this->pos = this->pos + 1;
      }
    }
    else {
      local_81 = 0;
      this->pos = this->pos + 1;
    }
  }
  if (local_5c != 0x22) {
    unexpected(this,TYPE_STRING,this->pos);
  }
  std::__cxx11::string::substr((ulong)local_c8,(ulong)&this->input);
  std::__cxx11::string::operator+=(local_80,local_c8);
  std::__cxx11::string::~string(local_c8);
  this->pos = this->pos + 1;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value,local_80);
  __return_storage_ptr__->end = this->pos;
  local_19 = 1;
  std::__cxx11::string::~string(local_80);
  if ((local_19 & 1) == 0) {
    Token::~Token(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Parser::readStringToken() {
        Token token(STRING, "");
        token.start = pos;
        int chunkStart = ++pos;
        int code;
        string value;
        bool isEscapeChar = false;

        while (isValidPos()) {
            if (isEscapeChar) {
                isEscapeChar = false;
                pos++;
                continue;
            }

            code = getCodeAt(pos);
            if (code == 34) { // '"'
                break;
            }
            if (code == 92) { // '\': escape
                isEscapeChar = true;
                value += input.substr(chunkStart, pos - chunkStart);
                chunkStart = ++pos;
            } else {
                pos++;
            }
        }

        if (code != 34) { // '"'
            unexpected(TYPE_STRING, pos);
        }

        value += input.substr(chunkStart, pos - chunkStart);
        pos++;
        token.value = value;
        token.end = pos;
        return token;
    }